

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool mkvmuxer::anon_unknown_12::CopyChromaticity
               (PrimaryChromaticity *src,PrimaryChromaticityPtr *dst)

{
  PrimaryChromaticity *pPVar1;
  PrimaryChromaticity *pPVar2;
  
  if (dst != (PrimaryChromaticityPtr *)0x0) {
    pPVar2 = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
    if (pPVar2 == (PrimaryChromaticity *)0x0) {
      pPVar2 = (PrimaryChromaticity *)0x0;
    }
    else {
      *pPVar2 = *src;
    }
    pPVar1 = (dst->_M_t).
             super___uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
             ._M_t.
             super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
             .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl;
    (dst->_M_t).
    super___uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
    ._M_t.
    super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
    .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl = pPVar2;
    if (pPVar1 != (PrimaryChromaticity *)0x0) {
      operator_delete(pPVar1);
    }
  }
  return dst != (PrimaryChromaticityPtr *)0x0;
}

Assistant:

bool CopyChromaticity(const PrimaryChromaticity* src,
                      PrimaryChromaticityPtr* dst) {
  if (!dst)
    return false;

  dst->reset(new (std::nothrow) PrimaryChromaticity(src->x(), src->y()));
  if (!dst)
    return false;

  return true;
}